

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall
DReachabilityPropagator::_propagateReachability(DReachabilityPropagator *this,bool local)

{
  FilteredLT *pFVar1;
  uint *puVar2;
  _func_int **pp_Var3;
  pointer pvVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  anon_union_8_2_743a5d44_for_Reason_0 r_00;
  ostream *poVar9;
  BoolView *pBVar10;
  uint uVar11;
  size_type __n;
  undefined1 learnt;
  undefined7 in_register_00000031;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint *puVar15;
  reference rVar16;
  int last_incident;
  Clause *expl;
  uint local_cc;
  Clause *r;
  Lit *pLStack_c0;
  Lit local_b0;
  uint local_ac;
  vector<bool,_std::allocator<bool>_> falsev;
  vector<bool,_std::allocator<bool>_> v;
  
  uVar13 = CONCAT71(in_register_00000031,local) & 0xffffffff;
  update_innodes(this);
  (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[1])();
  pFVar1 = this->lt;
  (**(pFVar1->super_LengauerTarjan)._vptr_LengauerTarjan)
            (pFVar1,(ulong)(uint)(pFVar1->super_LengauerTarjan).root);
  if (this->lt->visited_innodes < (this->in_nodes_tsize).v) {
    if (so.lazy == true) {
      uVar11 = 0xffffffff;
      puVar2 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      for (puVar15 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
          puVar15 = puVar15 + 1) {
        uVar8 = *puVar15;
        iVar7 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])(this->lt,(ulong)uVar8);
        if ((char)iVar7 == '\0') {
          uVar11 = uVar8;
        }
      }
      r = (Clause *)0x0;
      pLStack_c0 = (Lit *)0x0;
      v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)this->root);
      vec<Lit>::push((vec<Lit> *)&r,(Lit *)&v);
      v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           BoolView::getValLit((this->super_GraphPropagator).vs.data + uVar11);
      vec<Lit>::push((vec<Lit> *)&r,(Lit *)&v);
      falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((ulong)falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
           0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&v,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&falsev,
                 (allocator_type *)&expl);
      expl = (Clause *)((ulong)expl & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&falsev,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&expl,
                 (allocator_type *)&last_incident);
      learnt = (undefined1)uVar11;
      reverseDFStoBorder(this,uVar11,&v,&falsev,(vec<Lit> *)&r,-1);
      expl = Clause_new<vec<Lit>>((vec<Lit> *)&r,(bool)learnt);
      *(byte *)expl = *(byte *)expl | 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&expl);
      sat.confl = expl;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&falsev.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&v.super__Bvector_base<std::allocator<bool>_>);
      free(pLStack_c0);
    }
LAB_001a6999:
    bVar6 = false;
  }
  else {
    uVar14 = 0;
    while( true ) {
      pp_Var3 = (this->lt->super_LengauerTarjan)._vptr_LengauerTarjan;
      if ((long)(int)(this->super_GraphPropagator).vs.sz <= (long)uVar14) break;
      iVar7 = (*pp_Var3[7])();
      if ((char)iVar7 == '\0') {
        pBVar10 = (this->super_GraphPropagator).vs.data;
        if (sat.assigns.data[(uint)pBVar10[uVar14].v] == '\0') {
          if (so.lazy == true) {
            r = (Clause *)0x0;
            pLStack_c0 = (Lit *)0x0;
            vec<Lit>::push((vec<Lit> *)&r);
            v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p._0_4_ =
                 BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)this->root);
            vec<Lit>::push((vec<Lit> *)&r,(Lit *)&v);
            falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 ((ulong)falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                 0xffffffffffffff00);
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&v,(long)(int)(this->super_GraphPropagator).vs.sz,
                       (bool *)&falsev.super__Bvector_base<std::allocator<bool>_>,
                       (allocator_type *)&expl);
            expl = (Clause *)((ulong)expl & 0xffffffffffffff00);
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)
                       &falsev.super__Bvector_base<std::allocator<bool>_>,
                       (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&expl,
                       (allocator_type *)&last_incident);
            reverseDFStoBorder(this,(int)uVar14,&v,
                               (vector<bool,_std::allocator<bool>_> *)
                               &falsev.super__Bvector_base<std::allocator<bool>_>,(vec<Lit> *)&r,-1)
            ;
            r_00._pt = Reason_new<vec<Lit>>((vec<Lit> *)&r);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      (&falsev.super__Bvector_base<std::allocator<bool>_>);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      (&v.super__Bvector_base<std::allocator<bool>_>);
            free(pLStack_c0);
            pBVar10 = (this->super_GraphPropagator).vs.data;
          }
          else {
            r_00._pt = (Clause *)0x0;
          }
          BoolView::setVal(pBVar10 + uVar14,false,(Reason)r_00);
          if ((char)uVar13 != '\0') {
            iVar7 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                              (this,uVar14 & 0xffffffff);
            if ((char)iVar7 == '\0') goto LAB_001a6999;
            Tint::operator=(this->last_state_n + uVar14,1);
          }
        }
      }
      uVar14 = uVar14 + 1;
    }
    (*pp_Var3[3])();
    puVar2 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    local_ac = (uint)CONCAT71(in_register_00000031,local);
    for (puVar15 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
        puVar15 = puVar15 + 1) {
      uVar11 = *puVar15;
      uVar8 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[8])(this->lt,(ulong)uVar11);
      expl = (Clause *)CONCAT44(expl._4_4_,uVar8);
      local_cc = uVar11;
      if (((uVar11 != uVar8) && (uVar8 != 0xffffffff)) && (uVar11 != this->root)) {
        falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p =
             (_Bit_type *)
             ((ulong)falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
             0xffffffffffffff00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&v,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&falsev,
                   (allocator_type *)&r);
        __n = (size_type)(int)local_cc;
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&v,__n);
        if ((*rVar16._M_p & rVar16._M_mask) != 0) {
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)expl);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,local_cc);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,this->root);
          std::operator<<(poVar9,'\n');
        }
        r = (Clause *)0x0;
        uVar14 = (ulong)expl & 0xffffffff;
        pBVar10 = (this->super_GraphPropagator).vs.data;
        if (sat.assigns.data[(uint)pBVar10[uVar14].v] == '\0') {
          if (so.lazy == true) {
            explain_dominator(this,local_cc,(uint)expl,&r);
            uVar14 = (ulong)expl & 0xffffffff;
            pBVar10 = (this->super_GraphPropagator).vs.data;
          }
          BoolView::setVal(pBVar10 + uVar14,true,(Reason)r);
          if ((char)uVar13 == '\0') goto LAB_001a669d;
          add_innode(this,(uint)expl);
          iVar7 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x14])(this);
          if ((char)iVar7 != '\0') {
            Tint::operator=(this->last_state_n + (int)(uint)expl,0);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->new_node,(int *)&expl);
            goto LAB_001a669d;
          }
LAB_001a69b7:
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&v.super__Bvector_base<std::allocator<bool>_>);
          goto LAB_001a6999;
        }
LAB_001a669d:
        pBVar10 = (this->super_GraphPropagator).vs.data;
        if ((sat.assigns.data[(uint)pBVar10[(uint)expl].v] != '\0') &&
           (bVar6 = BoolView::isTrue(pBVar10 + (uint)expl), bVar6)) {
          last_incident = -1;
          falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._12_4_ = 0;
          if (so.lazy == true) {
            vec<Lit>::push((vec<Lit> *)&falsev);
          }
          pvVar4 = (this->in).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar5 = (uint *)pvVar4[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
          iVar7 = 0;
          for (puVar12 = *(uint **)&pvVar4[__n].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data; uVar11 = local_ac,
              puVar12 != puVar5; puVar12 = puVar12 + 1) {
            uVar11 = *puVar12;
            pBVar10 = (this->super_GraphPropagator).es.data;
            if ((sat.assigns.data[(uint)pBVar10[uVar11].v] == '\0') ||
               (bVar6 = BoolView::isTrue(pBVar10 + uVar11), bVar6)) {
              iVar7 = iVar7 + 1;
              last_incident = uVar11;
            }
            else if (so.lazy == true) {
              local_b0 = BoolView::getValLit((this->super_GraphPropagator).es.data + uVar11);
              vec<Lit>::push((vec<Lit> *)&falsev,&local_b0);
            }
          }
          uVar13 = (ulong)local_ac;
          if (iVar7 == 1) {
            uVar14 = (ulong)(uint)last_incident;
            pBVar10 = (this->super_GraphPropagator).es.data;
            if (sat.assigns.data[(uint)pBVar10[uVar14].v] == '\0') {
              if (so.lazy != false) {
                local_b0 = BoolView::getValLit((this->super_GraphPropagator).vs.data + local_cc);
                vec<Lit>::push((vec<Lit> *)&falsev,&local_b0);
                r = Reason_new<vec<Lit>>((vec<Lit> *)&falsev);
                uVar14 = (ulong)(uint)last_incident;
                pBVar10 = (this->super_GraphPropagator).es.data;
              }
              BoolView::setVal(pBVar10 + uVar14,true,(Reason)r);
              if ((char)uVar11 != '\0') {
                iVar7 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                                  (this,(ulong)(uint)last_incident);
                if ((char)iVar7 == '\0') {
                  free((void *)falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_);
                  goto LAB_001a69b7;
                }
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&this->new_edge,&last_incident);
                Tint::operator=(this->last_state_e + last_incident,0);
              }
            }
          }
          free((void *)falsev.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_);
        }
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&v.super__Bvector_base<std::allocator<bool>_>);
      }
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool DReachabilityPropagator::_propagateReachability(bool local) {
	update_innodes();
	// cout <<"PROPAGATE REACHABILITY"<<endl;
	lt->init();
	lt->LengauerTarjan::DFS();
	const int reached = lt->get_visited_innodes();
	if (DEBUG) {
		std::cout << "Reached " << reached << " in_nodes_tsize " << in_nodes_tsize
							<< " in_nodes.size() " << in_nodes_list.size() << '\n';
	}

	if (reached < in_nodes_tsize) {
		// FAIL because of not reaching some other node
		if (so.lazy) {
			int some_node = -1;
			for (const int i : in_nodes_list) {
				if (!lt->visited_dfs(i)) {
					some_node = i;
				}
			}
			assert(some_node != -1);
			vec<Lit> psfail;
			psfail.push(getNodeVar(get_root_idx()).getValLit());
			assert(getNodeVar(some_node).isFixed() && getNodeVar(some_node).isTrue());
			psfail.push(getNodeVar(some_node).getValLit());
			std::vector<bool> v(nbNodes(), false);
			std::vector<bool> falsev(nbNodes(), false);
			reverseDFStoBorder(some_node, v, falsev, psfail);
			if (DEBUG) {
				std::cout << "Expl size: " << psfail.size() << '\n';
			}
			Clause* expl = Clause_new(psfail);
			expl->temp_expl = 1;
			sat.rtrail.last().push(expl);
			sat.confl = expl;
		}
		return false;
	}
	//*
	for (int i = 0; i < nbNodes(); i++) {
		if (!lt->visited_dfs(i) && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(get_root_idx()).getValLit());
				std::vector<bool> v(nbNodes(), false);
				std::vector<bool> falsev(nbNodes(), false);
				reverseDFStoBorder(i, v, falsev, ps);
				r = Reason_new(ps);
			}
			getNodeVar(i).setVal(false, r);
			if (local) {
				if (!propagateRemNode(i)) {
					return false;
				}
				last_state_n[i] = VT_OUT;
			}
		}
	}  //*/

	lt->find_doms();
	// for (int i = 0; i < nbNodes(); i++)
	//     cerr <<"("<<i <<","<< lt->dominator(i)<<") ";
	// cerr<<endl;

	for (const int u : in_nodes_list) {
		assert(getNodeVar(u).isFixed());
		assert(getNodeVar(u).isTrue());
		if (DEBUG) {
			std::cout << "Looking at innode? u: " << u << " " << getNodeVar(u).isFixed() << '\n';
		}
		const int dom_u = lt->dominator(u);

		if (u == dom_u || dom_u == -1) {  // At the root
			continue;
		}
		if (u == get_root_idx()) {
			continue;
		}

		std::vector<bool> visited = std::vector<bool>(nbNodes(), false);
		if (DEBUG) {
			std::cout << "STARTING DFS (avoid " << dom_u << ")" << '\n';
			std::cout << "Nodes: ";
			for (int i = 0; i < nbNodes(); i++) {
				std::cout << i << "("
									<< (getNodeVar(i).isFixed() ? (getNodeVar(i).isTrue() ? "I" : "O") : "U") << "),";
			}
			std::cout << '\n';
			std::cout << "Edges: ";
			for (int i = 0; i < nbEdges(); i++) {
				std::cout << i << "[" << getTail(i) << "," << getHead(i) << "]"
									<< "(" << (getEdgeVar(i).isFixed() ? (getEdgeVar(i).isTrue() ? "I" : "O") : "U")
									<< "),";
			}
			std::cout << '\n';
		}
		assert(correctDominator(get_root_idx(), visited, dom_u));
		if (visited[u]) {
			std::cout << dom_u << " " << u << " " << get_root_idx() << '\n';
		}
		assert(!visited[u]);

		Clause* r = nullptr;

		if (!getNodeVar(dom_u).isFixed()) {
			// Fix the dominator
			//*
			if (so.lazy) {
				explain_dominator(u, dom_u, &r);
			}

			if (DEBUG) {
				std::cout << "Adding innode " << __FILE__ << __LINE__ << "(" << dom_u << " dominates " << u
									<< ")" << '\n';
			}
			getNodeVar(dom_u).setVal(true, r);
			if (local) {
				add_innode(dom_u);
				if (!propagateNewNode(dom_u)) {
					return false;
				}
				last_state_n[dom_u] = VT_IN;
				new_node.insert(dom_u);
			}
			//*/
		}

		if (getNodeVar(dom_u).isFixed() && getNodeVar(dom_u).isTrue()) {
			// Find bridge if any and enforce its endpoints
			int in_deg = 0;
			int last_incident = -1;
			vec<Lit> ps_in;
			if (so.lazy) {
				ps_in.push();
			}
			for (const int ie : in[u]) {
				if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
					in_deg++;
					last_incident = ie;
				} else if (so.lazy) {
					ps_in.push(getEdgeVar(ie).getValLit());
				}
			}
			if (in_deg == 1 && !getEdgeVar(last_incident).isFixed()) {
				//*
				if (so.lazy) {
					// ps_in.push(getNodeVar(dom_u).getValLit());
					ps_in.push(getNodeVar(u).getValLit());
					r = Reason_new(ps_in);
				}
				getEdgeVar(last_incident).setVal(true, r);
				if (local) {
					if (!propagateNewEdge(last_incident)) {
						return false;
					}
					if (DEBUG) {
						std::cout << "Adding inedge " << last_incident << " " << __FILE__ << __LINE__ << "("
											<< dom_u << " dominates " << u << ")" << '\n';
					}
					new_edge.insert(last_incident);
					last_state_e[last_incident] = VT_IN;
				}
				//*/
			}
		}
	}

	return true;
}